

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_shaderprogram.cpp
# Opt level: O0

void __thiscall FShaderProgram::~FShaderProgram(FShaderProgram *this)

{
  int local_14;
  int i;
  FShaderProgram *this_local;
  
  if (this->mProgram != 0) {
    (*_ptrc_glDeleteProgram)(this->mProgram);
  }
  for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
    if (this->mShaders[local_14] != 0) {
      (*_ptrc_glDeleteShader)(this->mShaders[local_14]);
    }
  }
  return;
}

Assistant:

FShaderProgram::~FShaderProgram()
{
	if (mProgram != 0)
		glDeleteProgram(mProgram);

	for (int i = 0; i < NumShaderTypes; i++)
	{
		if (mShaders[i] != 0)
			glDeleteShader(mShaders[i]);
	}
}